

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

smf_track_t * smf_track_new(void)

{
  int *piVar1;
  char *pcVar2;
  GPtrArray *pGVar3;
  smf_track_t *track;
  
  track = (smf_track_t *)malloc(0x40);
  if (track == (smf_track_t *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    g_log("libsmf",8,"Cannot allocate smf_track_t structure: %s",pcVar2);
    track = (smf_track_t *)0x0;
  }
  else {
    memset(track,0,0x40);
    track->next_event_number = -1;
    pGVar3 = (GPtrArray *)g_ptr_array_new();
    track->events_array = pGVar3;
    if (track->events_array == (GPtrArray *)0x0) {
      __assert_fail("track->events_array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x75,"smf_track_t *smf_track_new(void)");
    }
  }
  return track;
}

Assistant:

smf_track_t *
smf_track_new(void)
{
	smf_track_t *track = malloc(sizeof(smf_track_t));
	if (track == NULL) {
		g_critical("Cannot allocate smf_track_t structure: %s", strerror(errno));
		return (NULL);
	}

	memset(track, 0, sizeof(smf_track_t));
	track->next_event_number = -1;

	track->events_array = g_ptr_array_new();
	assert(track->events_array);

	return (track);
}